

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall spectest::ModuleCommand::ModuleCommand(ModuleCommand *this)

{
  (this->super_CommandMixin<(wabt::CommandType)0>).super_Command.type = First;
  (this->super_CommandMixin<(wabt::CommandType)0>).super_Command.line = 0;
  (this->super_CommandMixin<(wabt::CommandType)0>).super_Command._vptr_Command =
       (_func_int **)&PTR__ModuleCommand_001d4c80;
  this->module = Binary;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Command(CommandType type) : type(type) {}